

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,scatter_record *srec)

{
  element_type *peVar1;
  vec3 local_50;
  double local_38;
  double local_30;
  scatter_record *local_28;
  scatter_record *srec_local;
  hit_record *rec_local;
  ray *r_in_local;
  lambertian *this_local;
  
  local_28 = srec;
  srec_local = (scatter_record *)rec;
  rec_local = (hit_record *)r_in;
  r_in_local = (ray *)this;
  peVar1 = std::__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tex);
  (*peVar1->_vptr_texture[2])
            ((srec_local->skip_pdf_ray).dir.e[0],(srec_local->skip_pdf_ray).dir.e[1],local_50.e + 2,
             peVar1,srec_local);
  (local_28->attenuation).e[0] = local_50.e[2];
  (local_28->attenuation).e[1] = local_38;
  (local_28->attenuation).e[2] = local_30;
  std::make_shared<cosine_pdf,vec3_const&>(&local_50);
  std::shared_ptr<pdf>::operator=(&local_28->pdf_ptr,(shared_ptr<cosine_pdf> *)&local_50);
  std::shared_ptr<cosine_pdf>::~shared_ptr((shared_ptr<cosine_pdf> *)&local_50);
  local_28->skip_pdf = false;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, scatter_record& srec) const override {
        srec.attenuation = tex->value(rec.u, rec.v, rec.p);
        srec.pdf_ptr = make_shared<cosine_pdf>(rec.normal);
        srec.skip_pdf = false;
        return true;
    }